

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

int process_add_entry(archive_read *a,mtree *mtree,mtree_option **global,char *line,ssize_t line_len
                     ,mtree_entry **last_entry,int is_form_d)

{
  int iVar1;
  undefined8 *puVar2;
  uint *puVar3;
  void *pvVar4;
  size_t sVar5;
  char *__s;
  char *pcVar6;
  char *in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  archive *in_RDI;
  long in_R8;
  long *in_R9;
  int in_stack_00000008;
  int r;
  size_t len;
  char *end;
  char *name;
  char *eq;
  char *next;
  mtree_option *iter;
  mtree_entry *entry;
  char *len_00;
  mtree_entry *in_stack_ffffffffffffff58;
  archive *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  mtree_option **in_stack_ffffffffffffff70;
  archive_read *in_stack_ffffffffffffff78;
  size_t local_70;
  char *local_68;
  char *local_60;
  undefined8 *local_48;
  long local_30;
  char *local_28;
  int local_4;
  
  puVar2 = (undefined8 *)malloc(0x20);
  if (puVar2 == (undefined8 *)0x0) {
    puVar3 = (uint *)__errno_location();
    archive_set_error(in_RDI,(int)(ulong)*puVar3,"Can\'t allocate memory");
    local_4 = -0x1e;
  }
  else {
    *puVar2 = 0;
    puVar2[1] = 0;
    puVar2[2] = 0;
    *(undefined1 *)((long)puVar2 + 0x19) = 0;
    *(undefined1 *)(puVar2 + 3) = 0;
    if (*in_R9 == 0) {
      *(undefined8 **)(in_RSI + 0x40) = puVar2;
    }
    else {
      *(undefined8 **)*in_R9 = puVar2;
    }
    *in_R9 = (long)puVar2;
    if (in_stack_00000008 == 0) {
      local_70 = strcspn(in_RCX," \t\r\n");
      local_28 = in_RCX + local_70;
      local_68 = local_28 + in_R8;
      local_60 = in_RCX;
    }
    else {
      local_60 = in_RCX + in_R8;
      local_30 = in_R8;
      while ((local_60 = local_60 + -1, 0 < local_30 &&
             ((((*local_60 == '\r' || (*local_60 == '\n')) || (*local_60 == '\t')) ||
              (*local_60 == ' '))))) {
        local_30 = local_30 + -1;
      }
      local_70 = 0;
      for (; 0 < local_30; local_30 = local_30 + -1) {
        if (((*local_60 == '\r') || (*local_60 == '\n')) ||
           ((*local_60 == '\t' || (*local_60 == ' ')))) {
          local_60 = local_60 + 1;
          break;
        }
        local_60 = local_60 + -1;
        local_70 = local_70 + 1;
      }
      local_68 = local_60;
      local_28 = in_RCX;
    }
    pvVar4 = malloc(local_70 + 1);
    puVar2[2] = pvVar4;
    if (pvVar4 == (void *)0x0) {
      puVar3 = (uint *)__errno_location();
      archive_set_error(in_RDI,(int)(ulong)*puVar3,"Can\'t allocate memory");
      local_4 = -0x1e;
    }
    else {
      memcpy((void *)puVar2[2],local_60,local_70);
      *(undefined1 *)(puVar2[2] + local_70) = 0;
      parse_escapes((char *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      for (local_48 = (undefined8 *)*in_RDX; local_48 != (undefined8 *)0x0;
          local_48 = (undefined8 *)*local_48) {
        in_stack_ffffffffffffff68 = (char *)(puVar2 + 1);
        in_stack_ffffffffffffff70 = (mtree_option **)local_48[1];
        in_stack_ffffffffffffff60 = in_RDI;
        strlen((char *)local_48[1]);
        iVar1 = add_option(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                           in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60);
        if (iVar1 != 0) {
          return iVar1;
        }
      }
      do {
        sVar5 = strspn(local_28," \t\r\n");
        __s = local_28 + sVar5;
        if (*__s == '\0') {
          return 0;
        }
        if (local_68 <= __s) {
          return 0;
        }
        len_00 = __s;
        sVar5 = strcspn(__s," \t\r\n");
        pcVar6 = len_00 + sVar5;
        strchr(__s,0x3d);
        remove_option((mtree_option **)in_stack_ffffffffffffff60,local_28,(size_t)len_00);
        local_4 = add_option(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                             in_stack_ffffffffffffff68,(size_t)in_stack_ffffffffffffff60);
        local_28 = pcVar6;
      } while (local_4 == 0);
    }
  }
  return local_4;
}

Assistant:

static int
process_add_entry(struct archive_read *a, struct mtree *mtree,
    struct mtree_option **global, const char *line, ssize_t line_len,
    struct mtree_entry **last_entry, int is_form_d)
{
	struct mtree_entry *entry;
	struct mtree_option *iter;
	const char *next, *eq, *name, *end;
	size_t len;
	int r;

	if ((entry = malloc(sizeof(*entry))) == NULL) {
		archive_set_error(&a->archive, errno, "Can't allocate memory");
		return (ARCHIVE_FATAL);
	}
	entry->next = NULL;
	entry->options = NULL;
	entry->name = NULL;
	entry->used = 0;
	entry->full = 0;

	/* Add this entry to list. */
	if (*last_entry == NULL)
		mtree->entries = entry;
	else
		(*last_entry)->next = entry;
	*last_entry = entry;

	if (is_form_d) {
		/*
		 * This form places the file name as last parameter.
		 */
		name = line + line_len -1;
		while (line_len > 0) {
			if (*name != '\r' && *name != '\n' &&
			    *name != '\t' && *name != ' ')
				break;
			name--;
			line_len--;
		}
		len = 0;
		while (line_len > 0) {
			if (*name == '\r' || *name == '\n' ||
			    *name == '\t' || *name == ' ') {
				name++;
				break;
			}
			name--;
			line_len--;
			len++;
		}
		end = name;
	} else {
		len = strcspn(line, " \t\r\n");
		name = line;
		line += len;
		end = line + line_len;
	}

	if ((entry->name = malloc(len + 1)) == NULL) {
		archive_set_error(&a->archive, errno, "Can't allocate memory");
		return (ARCHIVE_FATAL);
	}

	memcpy(entry->name, name, len);
	entry->name[len] = '\0';
	parse_escapes(entry->name, entry);

	for (iter = *global; iter != NULL; iter = iter->next) {
		r = add_option(a, &entry->options, iter->value,
		    strlen(iter->value));
		if (r != ARCHIVE_OK)
			return (r);
	}

	for (;;) {
		next = line + strspn(line, " \t\r\n");
		if (*next == '\0')
			return (ARCHIVE_OK);
		if (next >= end)
			return (ARCHIVE_OK);
		line = next;
		next = line + strcspn(line, " \t\r\n");
		eq = strchr(line, '=');
		if (eq == NULL || eq > next)
			len = next - line;
		else
			len = eq - line;

		remove_option(&entry->options, line, len);
		r = add_option(a, &entry->options, line, next - line);
		if (r != ARCHIVE_OK)
			return (r);
		line = next;
	}
}